

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionCall *call)

{
  size_t *this_00;
  FunctionDefinition *pFVar1;
  bool bVar2;
  int iVar3;
  Block *pBVar4;
  string *psVar5;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *this_01;
  pointer pBVar6;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *pvVar7;
  size_type sVar8;
  RuntimeException *pRVar9;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  *this_02;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar10;
  type pbVar11;
  unique_ptr *puVar12;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *this_03;
  const_reference pvVar13;
  pointer pFVar14;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *this_04;
  pointer pFVar15;
  size_type sVar16;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar17;
  size_type sVar18;
  const_iterator __first1;
  const_iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar19;
  insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  iVar20;
  unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
  local_450;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_448;
  __single_object descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  allocator local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  type joined_missing;
  undefined1 local_360 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missing;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_328;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  result_value_2;
  pointer last_definition_argument;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_300;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  result_value_1;
  pointer definition_argument;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_290;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  local_288;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  result_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  allocator local_1e1;
  string local_1e0;
  undefined1 local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argument_name;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *argument;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  call_mandatory_arguments;
  int index;
  bool named_started;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_81;
  string local_80;
  FunctionDefinition *local_60;
  FunctionDefinition *builtin;
  FunctionDefinition *function;
  Block *local_40;
  Block *target_object;
  string field_name;
  FunctionCall *call_local;
  DefaultEvaluator *this_local;
  
  field_name.field_2._8_8_ = call;
  std::__cxx11::string::string((string *)&target_object);
  pBVar4 = parser::element::ASTElement::get_parent((ASTElement *)field_name.field_2._8_8_);
  psVar5 = parser::element::FunctionCall::get_name_abi_cxx11_
                     ((FunctionCall *)field_name.field_2._8_8_);
  local_40 = navigate_object_tree(pBVar4,psVar5,(string *)&target_object);
  builtin = parser::element::Block::get_function(local_40,(string *)&target_object);
  pFVar1 = builtin;
  if ((builtin == (FunctionDefinition *)0x0) &&
     (local_60 = parser::element::Block::get_builtin(local_40,(string *)&target_object),
     pFVar1 = local_60, local_60 == (FunctionDefinition *)0x0)) {
    body._M_t.
    super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
    ._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
    .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl._7_1_ = 1;
    pRVar9 = (RuntimeException *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"TODO",&local_81);
    psVar5 = parser::element::FunctionCall::get_name_abi_cxx11_
                       ((FunctionCall *)field_name.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff38,"Function \"",psVar5);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff38,"\" has not been declared!");
    exception::RuntimeException::RuntimeException(pRVar9,0,&local_80,&local_a8);
    body._M_t.
    super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
    ._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
    .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl._7_1_ = 0;
    __cxa_throw(pRVar9,&exception::RuntimeException::typeinfo,
                exception::RuntimeException::~RuntimeException);
  }
  builtin = pFVar1;
  this_01 = parser::element::FunctionDefinition::get_body(builtin);
  std::unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  ::operator->(this_01);
  parser::element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)local_d8);
  pBVar6 = std::
           unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                         *)local_d8);
  pBVar4 = parser::element::ASTElement::__get_output_block((ASTElement *)field_name.field_2._8_8_);
  (*(pBVar6->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[5])(pBVar6,pBVar4);
  iVar3 = parser::element::FunctionCall::get_argument_count
                    ((FunctionCall *)field_name.field_2._8_8_);
  pvVar7 = parser::element::FunctionDefinition::get_arguments(builtin);
  sVar8 = std::
          vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
          ::size(pvVar7);
  if (sVar8 < (ulong)(long)iVar3) {
    call_mandatory_arguments._M_h._M_single_bucket._7_1_ = 1;
    pRVar9 = (RuntimeException *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"TODO",&local_f9);
    psVar5 = parser::element::FunctionCall::get_name_abi_cxx11_
                       ((FunctionCall *)field_name.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                   "Function \"",psVar5);
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                   "\" is called with too many parameters!");
    exception::RuntimeException::RuntimeException(pRVar9,0,&local_f8,&local_120);
    call_mandatory_arguments._M_h._M_single_bucket._7_1_ = 0;
    __cxa_throw(pRVar9,&exception::RuntimeException::typeinfo,
                exception::RuntimeException::~RuntimeException);
  }
  call_mandatory_arguments._M_h._M_single_bucket._6_1_ = 0;
  call_mandatory_arguments._M_h._M_single_bucket._0_4_ = 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  this_02 = parser::element::FunctionCall::get_arguments((FunctionCall *)field_name.field_2._8_8_);
  __end1 = std::
           vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ::begin(this_02);
  argument = (unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              *)std::
                vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ::end(this_02);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>_>
                                     *)&argument), bVar2) {
    argument_name.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>_>
         ::operator*(&__end1);
    pFVar15 = std::
              unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              ::operator->((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                            *)argument_name.field_2._8_8_);
    puVar12 = (unique_ptr *)parser::element::FunctionCallArgument::get_name_abi_cxx11_(pFVar15);
    bVar2 = std::unique_ptr::operator_cast_to_bool(puVar12);
    if (bVar2) {
      pFVar15 = std::
                unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                ::operator->((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                              *)argument_name.field_2._8_8_);
      puVar10 = parser::element::FunctionCallArgument::get_name_abi_cxx11_(pFVar15);
      pbVar11 = std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(puVar10);
      std::__cxx11::string::string((string *)local_1c0,(string *)pbVar11);
      call_mandatory_arguments._M_h._M_single_bucket._6_1_ = 1;
      bVar2 = parser::element::FunctionDefinition::check_argument(builtin,(string *)local_1c0);
      if (!bVar2) {
        pRVar9 = (RuntimeException *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1e0,"TODO",&local_1e1);
        pFVar15 = std::
                  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                  ::operator->((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                                *)argument_name.field_2._8_8_);
        puVar10 = parser::element::FunctionCallArgument::get_name_abi_cxx11_(pFVar15);
        pbVar11 = std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*(puVar10);
        std::operator+(&local_268,"Argument \"",pbVar11);
        std::operator+(&local_248,&local_268,"\" is not a valid for function \"");
        psVar5 = parser::element::FunctionCall::get_name_abi_cxx11_
                           ((FunctionCall *)field_name.field_2._8_8_);
        std::operator+(&local_228,&local_248,psVar5);
        std::operator+(&local_208,&local_228,"\"");
        exception::RuntimeException::RuntimeException(pRVar9,0,&local_1e0,&local_208);
        __cxa_throw(pRVar9,&exception::RuntimeException::typeinfo,
                    exception::RuntimeException::~RuntimeException);
      }
      bVar2 = parser::element::FunctionDefinition::check_mandatory(builtin,(string *)local_1c0);
      if (bVar2) {
        pVar19 = std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range1,(value_type *)local_1c0);
        result_value._M_t.
        super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
        .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
             (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
              )pVar19.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
      }
      reset_return_block();
      pFVar15 = std::
                unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                ::operator->((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                              *)argument_name.field_2._8_8_);
      (*(pFVar15->super_ASTElement)._vptr_ASTElement[2])(pFVar15,this);
      get_owned_return_block();
      pBVar6 = std::
               unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
               ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                             *)local_d8);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      unique_ptr(&local_290,&local_288);
      parser::element::Block::set_variable(pBVar6,(string *)local_1c0,&local_290,true);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      ~unique_ptr(&local_290);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      ~unique_ptr(&local_288);
      std::__cxx11::string::~string((string *)local_1c0);
    }
    else {
      if ((call_mandatory_arguments._M_h._M_single_bucket._6_1_ & 1) != 0) {
        definition_argument._6_1_ = 1;
        pRVar9 = (RuntimeException *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b0,"TODO",&local_2b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2d8,"Cannot use ordinals arguments after a named argument",
                   (allocator *)((long)&definition_argument + 7));
        exception::RuntimeException::RuntimeException(pRVar9,0,&local_2b0,&local_2d8);
        definition_argument._6_1_ = 0;
        __cxa_throw(pRVar9,&exception::RuntimeException::typeinfo,
                    exception::RuntimeException::~RuntimeException);
      }
      pvVar7 = parser::element::FunctionDefinition::get_arguments(builtin);
      pvVar13 = std::
                vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                ::at(pvVar7,(long)(int)call_mandatory_arguments._M_h._M_single_bucket);
      pFVar14 = std::
                unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                ::get(pvVar13);
      pFVar1 = builtin;
      psVar5 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar14);
      bVar2 = parser::element::FunctionDefinition::check_mandatory(pFVar1,psVar5);
      if (bVar2) {
        psVar5 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar14);
        pVar19 = std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range1,psVar5);
        result_value_1._M_t.
        super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
        .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
             (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
              )pVar19.first.
               super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ._M_cur;
      }
      reset_return_block();
      pFVar15 = std::
                unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                ::operator->((unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                              *)argument_name.field_2._8_8_);
      (*(pFVar15->super_ASTElement)._vptr_ASTElement[2])(pFVar15,this);
      get_owned_return_block();
      pBVar6 = std::
               unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
               ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                             *)local_d8);
      psVar5 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar14);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&last_definition_argument,&local_300);
      parser::element::Block::set_variable
                (pBVar6,psVar5,
                 (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&last_definition_argument,true);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                   *)&last_definition_argument);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      ~unique_ptr(&local_300);
    }
    call_mandatory_arguments._M_h._M_single_bucket._0_4_ =
         (int)call_mandatory_arguments._M_h._M_single_bucket + 1;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_*,_std::vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>_>
    ::operator++(&__end1);
  }
  puVar12 = (unique_ptr *)
            parser::element::FunctionCall::get_outer_argument
                      ((FunctionCall *)field_name.field_2._8_8_);
  bVar2 = std::unique_ptr::operator_cast_to_bool(puVar12);
  if (bVar2) {
    pvVar7 = parser::element::FunctionDefinition::get_arguments(builtin);
    this_03 = parser::element::FunctionDefinition::get_arguments(builtin);
    sVar8 = std::
            vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
            ::size(this_03);
    pvVar13 = std::
              vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
              ::at(pvVar7,sVar8 - 1);
    pFVar14 = std::
              unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
              ::get(pvVar13);
    pFVar1 = builtin;
    psVar5 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar14);
    bVar2 = parser::element::FunctionDefinition::check_mandatory(pFVar1,psVar5);
    if (bVar2) {
      psVar5 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar14);
      pVar19 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range1,psVar5);
      result_value_2._M_t.
      super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
      .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl =
           (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )pVar19.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
    }
    reset_return_block();
    this_04 = parser::element::FunctionCall::get_outer_argument
                        ((FunctionCall *)field_name.field_2._8_8_);
    pFVar15 = std::
              unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
              ::operator->(this_04);
    (*(pFVar15->super_ASTElement)._vptr_ASTElement[2])(pFVar15,this);
    get_owned_return_block();
    pBVar6 = std::
             unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ::operator->((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                           *)local_d8);
    psVar5 = parser::element::FunctionArgument::get_name_abi_cxx11_(pFVar14);
    this_00 = &missing._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)this_00,&local_328);
    parser::element::Block::set_variable
              (pBVar6,psVar5,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)this_00,true);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)&missing._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr(&local_328);
  }
  sVar16 = std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  puVar17 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_(builtin);
  sVar18 = std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(puVar17);
  if (sVar16 == sVar18) {
    bVar2 = parser::element::FunctionCall::is_late_call((FunctionCall *)field_name.field_2._8_8_);
    pBVar4 = local_40;
    pFVar1 = builtin;
    if (bVar2) {
      std::
      make_unique<ninx::parser::util::LateCallDescriptor,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>,ninx::parser::element::FunctionDefinition*&,ninx::parser::element::Block*&>
                (&local_448,(FunctionDefinition **)local_d8,(Block **)&builtin);
      pBVar4 = parser::element::ASTElement::get_parent((ASTElement *)field_name.field_2._8_8_);
      std::
      unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
      ::unique_ptr(&local_450,
                   (unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                    *)&local_448);
      parser::element::Block::__add_late_call(pBVar4,&local_450);
      std::
      unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
      ::~unique_ptr(&local_450);
      std::
      unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
      ::~unique_ptr((unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                     *)&local_448);
    }
    else {
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&descriptor,
                 (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)local_d8);
      evaluate_function(this,pBVar4,pFVar1,
                        (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                         *)&descriptor);
      std::
      unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
      ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                   *)&descriptor);
    }
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_d8);
    std::__cxx11::string::~string((string *)&target_object);
    return;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_360);
  puVar17 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_(builtin);
  __first1 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(puVar17);
  puVar17 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_(builtin);
  __last1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(puVar17);
  __first2 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
  __last2 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  __i = std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_360);
  iVar20 = std::
           inserter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_360,__i);
  iVar20 = std::
           set_difference<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
                     ((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                       )__first1.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur,
                      (_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                       )__last1.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur,
                      (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                       )__first2.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur,
                      (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                       )__last2.
                        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ._M_cur,iVar20);
  joined_missing.field_2._8_8_ = iVar20.container;
  boost::algorithm::
  join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,char[3]>
            ((type *)local_3c8,(algorithm *)local_360,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",(char (*) [3])joined_missing.field_2._8_8_);
  pRVar9 = (RuntimeException *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"TODO",&local_3e9);
  std::operator+(&local_430,"Missing required arguments: \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  std::operator+(&local_410,&local_430,"\"");
  exception::RuntimeException::RuntimeException(pRVar9,0,&local_3e8,&local_410);
  __cxa_throw(pRVar9,&exception::RuntimeException::typeinfo,
              exception::RuntimeException::~RuntimeException);
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionCall *call) {
    // Obtain the referenced object by navigating the name structure
    std::string field_name;
    auto target_object { navigate_object_tree(call->get_parent(), call->get_name(), field_name) };

    // Get the target function
    auto function {target_object->get_function(field_name)};

    if (!function) {
        // The function is not defined, check if it is a builtin one.
        auto builtin{target_object->get_builtin(field_name)};

        if (builtin) { // Builtin function exist.
            function = builtin;
        } else {  // Not a builtin either
            // TODO: add information of line number and origin
            throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Function \"" + call->get_name() +
                                                                          "\" has not been declared!");
        }
    }

    // Clone the function definition body, to generate a new instance
    auto body {function->get_body()->clone<ninx::parser::element::Block>()};

    body->__set_output_block(call->__get_output_block());

    // Load all the call arguments

    // Check if the call arguments are too many
    if (call->get_argument_count() > function->get_arguments().size()) {
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Function \""+call->get_name()+"\" is called with too many parameters!");
    }

    // Check if the named call arguments are present in the function definition and make sure that
    // after a named parameter, no ordinal parameters can be used.
    // Then populate the call arguments as function body block local variables
    bool named_started {false};
    int index {0};  // Current ordinal parameter index

    std::unordered_set<std::string> call_mandatory_arguments;

    for (auto &argument : call->get_arguments()) {
        if (argument->get_name()) {
            auto argument_name {*(argument->get_name())};
            named_started = true;

            if (!function->check_argument(argument_name)){
                // TODO: add information of line number and origin
                throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Argument \"" + *(argument->get_name()) +
                                                                              "\" is not a valid for function \""+call->get_name()+"\"");
            }

            if (function->check_mandatory(argument_name)) {
                call_mandatory_arguments.insert(argument_name);
            }

            // Evaluate the argument value and get the result
            reset_return_block();
            argument->accept(this);
            auto result_value {get_owned_return_block()};

            // Setup the argument as a local variable
            body->set_variable(argument_name, std::move(result_value), true);
        }else{
            // Check if an ordinal parameter has been used after a named parameter
            if (named_started) {
                // TODO: add information of line number and origin
                throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Cannot use ordinals arguments after a named argument");
            }

            auto definition_argument {function->get_arguments().at(static_cast<unsigned long long int>(index)).get()};

            if (function->check_mandatory(definition_argument->get_name())) {
                call_mandatory_arguments.insert(definition_argument->get_name());
            }

            // Evaluate the argument value and get the result
            reset_return_block();
            argument->accept(this);
            auto result_value {get_owned_return_block()};

            // Setup the argument as a local variable
            body->set_variable(definition_argument->get_name(), std::move(result_value), true);
        }
        index++;
    }

    // Add also the outer_argument
    if (call->get_outer_argument()) {
        auto last_definition_argument {function->get_arguments().at(function->get_arguments().size()-1).get()};

        if (function->check_mandatory(last_definition_argument->get_name())) {
            call_mandatory_arguments.insert(last_definition_argument->get_name());
        }

        // Evaluate the argument value and get the result
        reset_return_block();
        call->get_outer_argument()->accept(this);
        auto result_value {get_owned_return_block()};

        // Setup the argument as a local variable
        body->set_variable(last_definition_argument->get_name(), std::move(result_value), true);
    }

    // Check if all mandatory arguments are been used
    if (call_mandatory_arguments.size() != function->get_mandatory_arguments().size()) {
        std::set<std::string> missing;

        // Find the missing parameters by calculating the difference between the definition and the call
        std::set_difference(function->get_mandatory_arguments().begin(), function->get_mandatory_arguments().end(),
                            call_mandatory_arguments.begin(), call_mandatory_arguments.end(),
                            std::inserter(missing, missing.end()));

        auto joined_missing {boost::algorithm::join(missing, ", ")};
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Missing required arguments: \""+joined_missing+"\"");
    }

    if (!call->is_late_call()) {  // Not a late call, evaluate immediately
        evaluate_function(target_object, function, std::move(body));
    }else{  // Late call, register it to be called later.
        // Create the late call descriptor
        auto descriptor = std::make_unique<ninx::parser::util::LateCallDescriptor>(std::move(body), function, target_object);
        call->get_parent()->__add_late_call(std::move(descriptor));
    }
}